

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

void hypergeometric_cdf_values(int *n_data,int *sam,int *suc,int *pop,int *n,double *fx)

{
  double *fx_local;
  int *n_local;
  int *pop_local;
  int *suc_local;
  int *sam_local;
  int *n_data_local;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  *n_data = *n_data + 1;
  if (*n_data < 0x11) {
    *sam = hypergeometric_cdf_values::sam_vec[*n_data + -1];
    *suc = hypergeometric_cdf_values::suc_vec[*n_data + -1];
    *pop = hypergeometric_cdf_values::pop_vec[*n_data + -1];
    *n = hypergeometric_cdf_values::n_vec[*n_data + -1];
    *fx = hypergeometric_cdf_values::fx_vec[*n_data + -1];
  }
  else {
    *n_data = 0;
    *sam = 0;
    *suc = 0;
    *pop = 0;
    *n = 0;
    *fx = 0.0;
  }
  return;
}

Assistant:

void hypergeometric_cdf_values ( int &n_data, int &sam, int &suc, int &pop,
  int &n, double &fx )

//****************************************************************************80
//
//  Purpose:
//
//    HYPERGEOMETRIC_CDF_VALUES returns some values of the hypergeometric CDF.
//
//  Discussion:
//
//    CDF(X)(A,B) is the probability of at most X successes in A trials,
//    given that the probability of success on a single trial is B.
//
//    In Mathematica, the function can be evaluated by:
//
//      Needs["Statistics`DiscreteDistributions`]
//      dist = HypergeometricDistribution [ sam, suc, pop ]
//      CDF [ dist, n ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    05 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition, CRC Press, 1996, pages 651-652.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int &SAM, int &SUC, int &POP, the sample size,
//    success size, and population parameters of the function.
//
//    Output, int &N, the argument of the function.
//
//    Output, double &FX, the value of the function.
//
{
# define N_MAX 16

  static double fx_vec[N_MAX] = {
     0.6001858177500578E-01,
     0.2615284665839845E+00,
     0.6695237889132748E+00,
     0.1000000000000000E+01,
     0.1000000000000000E+01,
     0.5332595856827856E+00,
     0.1819495964117640E+00,
     0.4448047017527730E-01,
     0.9999991751316731E+00,
     0.9926860896560750E+00,
     0.8410799901444538E+00,
     0.3459800113391901E+00,
     0.0000000000000000E+00,
     0.2088888139634505E-02,
     0.3876752992448843E+00,
     0.9135215248834896E+00 };

  static int n_vec[N_MAX] = {
     7,  8,  9, 10,
     6,  6,  6,  6,
     6,  6,  6,  6,
     0,  0,  0,  0 };

  static int pop_vec[N_MAX] = {
    100, 100, 100, 100,
    100, 100, 100, 100,
    100, 100, 100, 100,
    90,  200, 1000, 10000 };

  static int sam_vec[N_MAX] = {
    10, 10, 10, 10,
     6,  7,  8,  9,
    10, 10, 10, 10,
    10, 10, 10, 10 };

  static int suc_vec[N_MAX] = {
    90, 90, 90, 90,
    90, 90, 90, 90,
    10, 30, 50, 70,
    90, 90, 90, 90 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    sam = 0;
    suc = 0;
    pop = 0;
    n = 0;
    fx = 0.0;
  }
  else
  {
    sam = sam_vec[n_data-1];
    suc = suc_vec[n_data-1];
    pop = pop_vec[n_data-1];
    n = n_vec[n_data-1];
    fx = fx_vec[n_data-1];
  }

  return;
# undef N_MAX
}